

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

XXH_errorcode ZSTD_XXH64_update(XXH64_state_t *state_in,void *input,size_t len)

{
  XXH_errorcode XVar1;
  ulong uVar3;
  long *plVar4;
  unsigned_long_long uVar5;
  unsigned_long_long uVar6;
  long *plVar7;
  unsigned_long_long uVar8;
  unsigned_long_long uVar9;
  ulong uVar10;
  void *pvVar2;
  
  state_in->total_len = state_in->total_len + len;
  uVar3 = (ulong)state_in->memsize;
  if (uVar3 + len < 0x20) {
    pvVar2 = memcpy((void *)((long)state_in->mem64 + uVar3),input,len);
    XVar1 = (XXH_errorcode)pvVar2;
    uVar3 = (ulong)((int)len + state_in->memsize);
  }
  else {
    plVar7 = (long *)(len + (long)input);
    if (uVar3 != 0) {
      memcpy((void *)((long)state_in->mem64 + uVar3),input,(ulong)(0x20 - state_in->memsize));
      uVar3 = state_in->mem64[0] * -0x3d4d51c2d82b14b1 + state_in->v1;
      state_in->v1 = (uVar3 * 0x80000000 | uVar3 >> 0x21) * -0x61c8864e7a143579;
      uVar3 = state_in->mem64[1] * -0x3d4d51c2d82b14b1 + state_in->v2;
      state_in->v2 = (uVar3 * 0x80000000 | uVar3 >> 0x21) * -0x61c8864e7a143579;
      uVar3 = state_in->mem64[2] * -0x3d4d51c2d82b14b1 + state_in->v3;
      state_in->v3 = (uVar3 * 0x80000000 | uVar3 >> 0x21) * -0x61c8864e7a143579;
      uVar3 = state_in->mem64[3] * -0x3d4d51c2d82b14b1 + state_in->v4;
      state_in->v4 = (uVar3 * 0x80000000 | uVar3 >> 0x21) * -0x61c8864e7a143579;
      input = (void *)((long)input + (ulong)(0x20 - state_in->memsize));
      state_in->memsize = 0;
    }
    plVar4 = (long *)((long)input + 0x20);
    if (plVar4 <= plVar7) {
      plVar4 = plVar7 + -4;
      uVar5 = state_in->v1;
      uVar6 = state_in->v2;
      uVar9 = state_in->v3;
      uVar8 = state_in->v4;
      do {
        uVar3 = *input * -0x3d4d51c2d82b14b1 + uVar5;
        uVar5 = (uVar3 * 0x80000000 | uVar3 >> 0x21) * -0x61c8864e7a143579;
        uVar3 = *(long *)((long)input + 8) * -0x3d4d51c2d82b14b1 + uVar6;
        uVar10 = *(long *)((long)input + 0x10) * -0x3d4d51c2d82b14b1 + uVar9;
        uVar6 = (uVar3 * 0x80000000 | uVar3 >> 0x21) * -0x61c8864e7a143579;
        uVar9 = (uVar10 * 0x80000000 | uVar10 >> 0x21) * -0x61c8864e7a143579;
        uVar3 = *(long *)((long)input + 0x18) * -0x3d4d51c2d82b14b1 + uVar8;
        uVar8 = (uVar3 * 0x80000000 | uVar3 >> 0x21) * -0x61c8864e7a143579;
        input = (void *)((long)input + 0x20);
      } while (input <= plVar4);
      state_in->v1 = uVar5;
      state_in->v2 = uVar6;
      state_in->v3 = uVar9;
      state_in->v4 = uVar8;
    }
    if (plVar7 <= input) {
      return (XXH_errorcode)plVar4;
    }
    uVar3 = (long)plVar7 - (long)input;
    pvVar2 = memcpy(state_in->mem64,input,uVar3);
    XVar1 = (XXH_errorcode)pvVar2;
  }
  state_in->memsize = (uint)uVar3;
  return XVar1;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH64_update (XXH64_state_t* state_in, const void* input, size_t len)
{
    XXH_endianess endian_detected = (XXH_endianess)XXH_CPU_LITTLE_ENDIAN;

    if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH64_update_endian(state_in, input, len, XXH_littleEndian);
    else
        return XXH64_update_endian(state_in, input, len, XXH_bigEndian);
}